

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
::PerformDefaultAction
          (FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
           *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  *this_00;
  runtime_error *this_01;
  ArgumentTuple *in_RDX;
  Action<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  *in_RSI;
  string message;
  OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  *spec;
  ArgumentTuple *in_stack_ffffffffffffffb0;
  FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  this_00 = FindOnCallSpec(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (this_00 ==
      (OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
       *)0x0) {
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = DefaultValue<TestResult>::Exists();
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<TestResult>::Get();
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  else {
    OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
    ::GetAction(this_00);
    Action<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
    ::Perform(in_RSI,in_RDX);
  }
  return;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }